

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opn.cpp
# Opt level: O1

void __thiscall
ymfm::opn_registers_base<false>::operator_map
          (opn_registers_base<false> *this,operator_mapping *dest)

{
  if (operator_map(ymfm::opn_registers_base<false>::operator_mapping&)::s_fixed_map == '\0') {
    operator_map();
  }
  dest->chan[2] = operator_map::s_fixed_map.chan[2];
  *(undefined8 *)dest->chan = operator_map::s_fixed_map.chan._0_8_;
  return;
}

Assistant:

void opn_registers_base<false>::operator_map(operator_mapping &dest) const
{
	// Note that the channel index order is 0,2,1,3, so we bitswap the index.
	//
	// This is because the order in the map is:
	//    carrier 1, carrier 2, modulator 1, modulator 2
	//
	// But when wiring up the connections, the more natural order is:
	//    carrier 1, modulator 1, carrier 2, modulator 2
	static const operator_mapping s_fixed_map =
	{ {
		operator_list(  0,  6,  3,  9 ),  // Channel 0 operators
		operator_list(  1,  7,  4, 10 ),  // Channel 1 operators
		operator_list(  2,  8,  5, 11 ),  // Channel 2 operators
	} };
	dest = s_fixed_map;
}